

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O2

void __thiscall Liby::FileDescriptor::set_noblock(FileDescriptor *this,bool flag)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fcntl(this->fd_,3);
  if (-1 < (int)uVar1) {
    iVar2 = fcntl(this->fd_,4,(ulong)((uint)flag << 0xb | uVar1 & 0x7ffff7ff));
    if (-1 < iVar2) {
      return;
    }
  }
  throw_err();
  return;
}

Assistant:

void Liby::FileDescriptor::set_noblock(bool flag) {
    int opt;
    opt = ::fcntl(fd_, F_GETFL);
    if (opt < 0) {
        throw_err();
    }
    opt = flag ? (opt | O_NONBLOCK) : (opt & ~O_NONBLOCK);
    if (::fcntl(fd_, F_SETFL, opt) < 0) {
        throw_err();
    }
}